

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_positional_reference.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformPositionalReference(Transformer *this,PGPositionalReference *node)

{
  unsigned_long index;
  Transformer *this_00;
  type expr;
  ParserException *this_01;
  long in_RDX;
  pointer *__ptr;
  templated_unique_single_t result;
  string local_48;
  
  if (0 < *(int *)(in_RDX + 4)) {
    index = NumericCastImpl<unsigned_long,_int,_false>::Convert(*(int *)(in_RDX + 4));
    this_00 = (Transformer *)operator_new(0x40);
    PositionalReferenceExpression::PositionalReferenceExpression
              ((PositionalReferenceExpression *)this_00,index);
    local_48._M_dataplus._M_p = (pointer)this_00;
    expr = unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
           ::operator*((unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
                        *)&local_48);
    SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 8));
    (this->parent).ptr = (Transformer *)local_48._M_dataplus._M_p;
    return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
           this;
  }
  this_01 = (ParserException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Positional reference node needs to be >= 1","");
  ParserException::ParserException(this_01,&local_48);
  __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformPositionalReference(duckdb_libpgquery::PGPositionalReference &node) {
	if (node.position <= 0) {
		throw ParserException("Positional reference node needs to be >= 1");
	}
	auto result = make_uniq<PositionalReferenceExpression>(NumericCast<idx_t>(node.position));
	SetQueryLocation(*result, node.location);
	return std::move(result);
}